

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DLightFlash::Tick(DLightFlash *this)

{
  int *piVar1;
  sector_t_conflict *psVar2;
  uint uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  
  piVar1 = &this->m_Count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  psVar2 = (this->super_DLighting).super_DSectorEffect.m_Sector;
  iVar5 = this->m_MaxLight;
  if (iVar5 == psVar2->lightlevel) {
    iVar5 = 0x7fff;
    if (this->m_MinLight < 0x7fff) {
      iVar5 = this->m_MinLight;
    }
    sVar4 = -0x8000;
    if (-0x8000 < iVar5) {
      sVar4 = (short)iVar5;
    }
    psVar2->lightlevel = sVar4;
    uVar3 = FRandom::operator()(&pr_lightflash);
    uVar3 = uVar3 & this->m_MinTime;
  }
  else {
    iVar6 = 0x7fff;
    if (iVar5 < 0x7fff) {
      iVar6 = iVar5;
    }
    sVar4 = -0x8000;
    if (-0x8000 < iVar6) {
      sVar4 = (short)iVar6;
    }
    psVar2->lightlevel = sVar4;
    uVar3 = FRandom::operator()(&pr_lightflash);
    uVar3 = uVar3 & this->m_MaxTime;
  }
  this->m_Count = uVar3 + 1;
  return;
}

Assistant:

void DLightFlash::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MaxLight)
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = (pr_lightflash() & m_MinTime) + 1;
		}
		else
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = (pr_lightflash() & m_MaxTime) + 1;
		}
	}
}